

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.h
# Opt level: O3

iterator __thiscall
fmt::v6::formatter<std::vector<int,std::allocator<int>>,char,void>::
format<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
          (formatter<std::vector<int,std::allocator<int>>,char,void> *this,
          vector<int,_std::allocator<int>_> *values,
          basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
          *ctx)

{
  formatter<std::vector<int,std::allocator<int>>,char,void> fVar1;
  buffer<char> *pbVar2;
  pointer piVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  char *__s;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  ulong local_68 [2];
  undefined **local_58 [2];
  size_t local_48;
  size_t local_40;
  buffer<char> *local_38;
  
  fVar1 = *this;
  pbVar2 = (ctx->out_).container;
  sVar7 = pbVar2->size_;
  uVar9 = sVar7 + 1;
  if (pbVar2->capacity_ < uVar9) {
    (**pbVar2->_vptr_buffer)(pbVar2);
    sVar7 = pbVar2->size_;
    uVar9 = sVar7 + 1;
  }
  pbVar2->size_ = uVar9;
  *(formatter<std::vector<int,std::allocator<int>>,char,void> *)(pbVar2->ptr_ + sVar7) = fVar1;
  piVar3 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar4) {
    lVar10 = 0;
    do {
      __s = "{}";
      if (lVar10 != 0) {
        fVar1 = this[1];
        sVar7 = pbVar2->size_;
        uVar9 = sVar7 + 1;
        if (pbVar2->capacity_ < uVar9) {
          (**pbVar2->_vptr_buffer)(pbVar2);
          sVar7 = pbVar2->size_;
          uVar9 = sVar7 + 1;
        }
        pbVar2->size_ = uVar9;
        *(formatter<std::vector<int,std::allocator<int>>,char,void> *)(pbVar2->ptr_ + sVar7) = fVar1
        ;
        __s = " {}";
      }
      sVar8 = strlen(__s);
      local_68[0] = (ulong)*(uint *)((long)piVar3 + lVar10);
      local_48 = pbVar2->size_;
      local_58[0] = &PTR_grow_0018b320;
      format_str.size_ = sVar8;
      format_str.data_ = __s;
      args.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)local_68;
      args.types_ = 2;
      local_40 = local_48;
      local_38 = pbVar2;
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)local_58,format_str,args,(locale_ref)0x0);
      if (lVar10 == 0x400) {
        local_68[0] = 0;
        local_48 = pbVar2->size_;
        local_58[0] = &PTR_grow_0018b320;
        format_str_00.size_ = 0x15;
        format_str_00.data_ = " ... <other elements>";
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_68;
        local_40 = local_48;
        local_38 = pbVar2;
        vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                  ((range)local_58,format_str_00,
                   (basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                    )(auVar5 << 0x40),(locale_ref)0x0);
        break;
      }
      lVar6 = lVar10 + 4;
      lVar10 = lVar10 + 4;
    } while ((pointer)((long)piVar3 + lVar6) != piVar4);
  }
  fVar1 = this[2];
  sVar7 = pbVar2->size_;
  uVar9 = sVar7 + 1;
  if (pbVar2->capacity_ < uVar9) {
    (**pbVar2->_vptr_buffer)(pbVar2);
    sVar7 = pbVar2->size_;
    uVar9 = sVar7 + 1;
  }
  pbVar2->size_ = uVar9;
  *(formatter<std::vector<int,std::allocator<int>>,char,void> *)(pbVar2->ptr_ + sVar7) = fVar1;
  return (iterator)pbVar2;
}

Assistant:

typename FormatContext::iterator format(const RangeT& values,
                                          FormatContext& ctx) {
    auto out = internal::copy(formatting.prefix, ctx.out());
    std::size_t i = 0;
    for (auto it = values.begin(), end = values.end(); it != end; ++it) {
      if (i > 0) {
        if (formatting.add_prepostfix_space) *out++ = ' ';
        out = internal::copy(formatting.delimiter, out);
      }
      out = format_to(out,
                      internal::format_str_quoted(
                          (formatting.add_delimiter_spaces && i > 0), *it),
                      *it);
      if (++i > formatting.range_length_limit) {
        out = format_to(out, " ... <other elements>");
        break;
      }
    }
    if (formatting.add_prepostfix_space) *out++ = ' ';
    return internal::copy(formatting.postfix, out);
  }